

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_discrete_cosine_transform.cc
# Opt level: O2

bool __thiscall
sptk::InverseDiscreteCosineTransform::Run
          (InverseDiscreteCosineTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  FourierTransformInterface *pFVar4;
  int iVar5;
  uint uVar6;
  pointer pdVar7;
  long lVar8;
  ulong uVar9;
  pointer pdVar10;
  pointer pdVar11;
  ulong uVar12;
  size_type __new_size;
  
  iVar5 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[3])();
  if (((char)iVar5 != '\0') &&
     (lVar8 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start, lVar8 >> 3 == (long)this->dct_length_)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (imag_part_output == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if (real_part_output == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar8) {
      return false;
    }
    uVar6 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[2])()
    ;
    this_00 = &buffer->fourier_transform_real_part_;
    __new_size = (size_type)(int)uVar6;
    if ((long)(buffer->fourier_transform_real_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(buffer->fourier_transform_real_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
    }
    this_01 = &buffer->fourier_transform_imag_part_;
    if ((long)(buffer->fourier_transform_imag_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(buffer->fourier_transform_imag_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
    }
    pdVar7 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pdVar11 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)pdVar10 - (long)pdVar7 != 0) {
      memmove(pdVar11,pdVar7,(long)pdVar10 - (long)pdVar7);
      pdVar7 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      pdVar11 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::negate<double>>
              (pdVar7 + 1,pdVar10,pdVar11 + (long)this->dct_length_ + 1);
    std::__reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((buffer->fourier_transform_real_part_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + (long)this->dct_length_ + 1,
               (buffer->fourier_transform_real_part_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish);
    lVar8 = (long)this->dct_length_;
    (buffer->fourier_transform_real_part_).super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar8] = 0.0;
    pdVar7 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pdVar10 - (long)pdVar7 != 0) {
      memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar7,(long)pdVar10 - (long)pdVar7);
      pdVar7 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar8 = (long)this->dct_length_;
    }
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::negate<double>>
              (pdVar7 + 1,pdVar10,
               (buffer->fourier_transform_imag_part_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar8 + 1);
    std::__reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((buffer->fourier_transform_imag_part_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + (long)this->dct_length_ + 1,
               (buffer->fourier_transform_imag_part_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish);
    pdVar7 = (buffer->fourier_transform_imag_part_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar7[this->dct_length_] = 0.0;
    pdVar10 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar3 = (buffer->fourier_transform_real_part_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar12 = 0;
    uVar9 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar9 = uVar12;
    }
    for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      dVar1 = pdVar3[uVar12];
      dVar2 = pdVar7[uVar12];
      pdVar3[uVar12] = pdVar10[uVar12] * dVar1 - pdVar11[uVar12] * dVar2;
      pdVar7[uVar12] = dVar1 * pdVar11[uVar12] + dVar2 * pdVar10[uVar12];
    }
    pFVar4 = (this->fourier_transform_).fourier_transform_;
    iVar5 = (*pFVar4->_vptr_FourierTransformInterface[4])
                      (pFVar4,this_00,this_01,real_part_output,imag_part_output);
    if ((char)iVar5 != '\0') {
      std::vector<double,_std::allocator<double>_>::resize(real_part_output,(long)this->dct_length_)
      ;
      std::vector<double,_std::allocator<double>_>::resize(imag_part_output,(long)this->dct_length_)
      ;
      return true;
    }
  }
  return false;
}

Assistant:

bool InverseDiscreteCosineTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    InverseDiscreteCosineTransform::Buffer* buffer) const {
  // Check inputs.
  if (!fourier_transform_.IsValid() ||
      real_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int dft_length(fourier_transform_.GetLength());
  if (buffer->fourier_transform_real_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_real_part_.resize(dft_length);
  }
  if (buffer->fourier_transform_imag_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_imag_part_.resize(dft_length);
  }

  // Prepare real part input.
  std::copy(real_part_input.begin(), real_part_input.end(),
            buffer->fourier_transform_real_part_.begin());
  std::transform(real_part_input.begin() + 1, real_part_input.end(),
                 buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_real_part_.end());
  buffer->fourier_transform_real_part_[dct_length_] = 0.0;

  // Prepare imaginary part input.
  std::copy(imag_part_input.begin(), imag_part_input.end(),
            buffer->fourier_transform_imag_part_.begin());
  std::transform(imag_part_input.begin() + 1, imag_part_input.end(),
                 buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_imag_part_.end());
  buffer->fourier_transform_imag_part_[dct_length_] = 0.0;

  const double* cosine_table(&(cosine_table_[0]));
  const double* sine_table(&(sine_table_[0]));
  double* fourier_transform_real_part(&buffer->fourier_transform_real_part_[0]);
  double* fourier_transform_imag_part(&buffer->fourier_transform_imag_part_[0]);

  for (int i(0); i < dft_length; ++i) {
    const double temp_real_part(fourier_transform_real_part[i]);
    const double temp_imag_part(fourier_transform_imag_part[i]);
    fourier_transform_real_part[i] =
        temp_real_part * cosine_table[i] - temp_imag_part * sine_table[i];
    fourier_transform_imag_part[i] =
        temp_real_part * sine_table[i] + temp_imag_part * cosine_table[i];
  }

  if (!fourier_transform_.Run(buffer->fourier_transform_real_part_,
                              buffer->fourier_transform_imag_part_,
                              real_part_output, imag_part_output)) {
    return false;
  }

  real_part_output->resize(dct_length_);
  imag_part_output->resize(dct_length_);

  return true;
}